

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptRegularExpression.cpp
# Opt level: O0

Var Js::JavascriptRegExp::OP_NewRegEx(RegexPattern *aCompiledRegex,ScriptContext *scriptContext)

{
  ScriptContext *pattern;
  Recycler *pRVar1;
  JavascriptRegExp *this;
  JavascriptLibrary *this_00;
  DynamicType *type;
  TrackAllocData local_48;
  JavascriptRegExp *pNewInstance;
  ScriptContext *scriptContext_local;
  RegexPattern *aCompiledRegex_local;
  
  pNewInstance = (JavascriptRegExp *)scriptContext;
  scriptContext_local = (ScriptContext *)aCompiledRegex;
  pRVar1 = ScriptContext::GetRecycler(scriptContext);
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_48,(type_info *)&typeinfo,0,0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptRegularExpression.cpp"
             ,0x26d);
  pRVar1 = Memory::Recycler::TrackAllocInfo(pRVar1,&local_48);
  this = (JavascriptRegExp *)new<Memory::Recycler>(0x40,pRVar1,0x43c4b0);
  pattern = scriptContext_local;
  this_00 = ScriptContext::GetLibrary((ScriptContext *)pNewInstance);
  type = JavascriptLibrary::GetRegexType(this_00);
  JavascriptRegExp(this,(RegexPattern *)pattern,type);
  return this;
}

Assistant:

Var JavascriptRegExp::OP_NewRegEx(UnifiedRegex::RegexPattern* aCompiledRegex, ScriptContext* scriptContext)
    {
        JavascriptRegExp * pNewInstance =
            RecyclerNew(scriptContext->GetRecycler(), JavascriptRegExp, aCompiledRegex,
            scriptContext->GetLibrary()->GetRegexType());
        return pNewInstance;
    }